

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_text.cpp
# Opt level: O2

void Am_Text_Command_Repeat_New_proc
               (Am_Object *command_obj,Am_Value *new_selection,Am_Value *new_value)

{
  bool bVar1;
  ostream *poVar2;
  Am_Object new_obj;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Value local_30;
  
  new_obj.data = (Am_Object_Data *)0x0;
  bVar1 = Am_Value::Valid(new_selection);
  if (bVar1) {
    if (new_selection->type != 0xa001) {
      Am_Error("Am_Text_Command_Repeat_New called with non-object");
    }
    Am_Object::operator=(&new_obj,new_selection);
    Am_Object::Am_Object(&local_38,&Am_Text);
    bVar1 = Am_Object::Is_Instance_Of(&new_obj,&local_38);
    Am_Object::~Am_Object(&local_38);
    if (bVar1) {
      Am_Object::operator=(&new_obj,&Am_No_Object);
    }
  }
  bVar1 = Am_Value::Valid(new_value);
  if ((bVar1) && (new_value->type != 0x8008)) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
    poVar2 = std::operator<<(poVar2,"Selective repeat on ");
    poVar2 = operator<<(poVar2,command_obj);
    poVar2 = std::operator<<(poVar2," but new value not string ");
    poVar2 = operator<<(poVar2,new_value);
    std::endl<char,std::char_traits<char>>(poVar2);
    Am_Error();
  }
  Am_Object::Am_Object(&local_40,command_obj);
  Am_Object::Am_Object(&local_48,&new_obj);
  Am_Value::Am_Value(&local_30,new_value);
  text_general_undo_redo(&local_40,false,true,true,&local_48,&local_30);
  Am_Value::~Am_Value(&local_30);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&new_obj);
  return;
}

Assistant:

Am_Define_Method(Am_Selective_Repeat_New_Method, void,
                 Am_Text_Command_Repeat_New,
                 (Am_Object command_obj, Am_Value new_selection,
                  Am_Value new_value))
{
  Am_Object new_obj;
  if (new_selection.Valid()) {
    if (new_selection.type == Am_OBJECT)
      new_obj = new_selection;
    else
      Am_Error("Am_Text_Command_Repeat_New called with non-object");
    if (new_obj.Is_Instance_Of(Am_Text)) //ignore new_obj
      new_obj = Am_No_Object;
  }
  if (new_value.Valid() && new_value.type != Am_STRING)
    Am_ERRORO("Selective repeat on "
                  << command_obj << " but new value not string " << new_value,
              command_obj, 0);
  text_general_undo_redo(command_obj, false, true, true, new_obj, new_value);
}